

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O0

int deqp::gles3::Functional::getVectorsFromComps(Functions *gl,deUint32 pname)

{
  GLenum err;
  char *msg;
  Enum<int,_2UL> EVar1;
  GetNameFunc local_88;
  int local_80;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  GLint local_18;
  deUint32 local_14;
  int value;
  deUint32 pname_local;
  Functions *gl_local;
  
  local_18 = -1;
  local_14 = pname;
  _value = gl;
  (*gl->getIntegerv)(pname,&local_18);
  err = (*_value->getError)();
  EVar1 = glu::getGettableStateStr(local_14);
  local_88 = EVar1.m_getName;
  local_80 = EVar1.m_value;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_88);
  std::operator+(&local_58,"glGetIntegerv(",&local_78);
  std::operator+(&local_38,&local_58,")");
  msg = (char *)std::__cxx11::string::c_str();
  glu::checkError(err,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                  ,0x4b);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return local_18 / 4;
}

Assistant:

static int getVectorsFromComps (const glw::Functions& gl, deUint32 pname)
{
	int value = -1;
	gl.getIntegerv(pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), ("glGetIntegerv(" + glu::getGettableStateStr((int)pname).toString() + ")").c_str());
	// Accept truncated division. According to the spec, the number of vectors is number of components divided by four, plain and simple.
	return value/4;
}